

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O3

Position * __thiscall
iDynTree::Position::operator+(Position *__return_storage_ptr__,Position *this,Position *other)

{
  double dVar1;
  double dVar2;
  Position *result;
  
  Position(__return_storage_ptr__);
  dVar1 = (this->super_Vector3).m_data[1];
  dVar2 = (other->super_Vector3).m_data[1];
  (__return_storage_ptr__->super_Vector3).m_data[0] =
       (other->super_Vector3).m_data[0] + (this->super_Vector3).m_data[0];
  (__return_storage_ptr__->super_Vector3).m_data[1] = dVar2 + dVar1;
  (__return_storage_ptr__->super_Vector3).m_data[2] =
       (this->super_Vector3).m_data[2] + (other->super_Vector3).m_data[2];
  return __return_storage_ptr__;
}

Assistant:

Position Position::operator+(const Position& other) const
    {
        return compose(*this,other);
    }